

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalBatchCopyToFile,duckdb::vector<duckdb::LogicalType,true>&,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,CopyFunction *args_1,
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *args_2,
          unsigned_long *args_3)

{
  PhysicalBatchCopyToFile *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_308;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_300;
  reference_wrapper<duckdb::PhysicalOperator> local_2e8;
  CopyFunction local_2e0;
  
  this_00 = (PhysicalBatchCopyToFile *)ArenaAllocator::AllocateAligned(&this->arena,0x360);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_300,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  CopyFunction::CopyFunction(&local_2e0,args_1);
  local_308._M_head_impl =
       (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
       _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  PhysicalBatchCopyToFile::PhysicalBatchCopyToFile
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_300,&local_2e0,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_308,*args_3);
  if (local_308._M_head_impl != (FunctionData *)0x0) {
    (*(local_308._M_head_impl)->_vptr_FunctionData[1])();
  }
  local_308._M_head_impl = (FunctionData *)0x0;
  CopyFunction::~CopyFunction(&local_2e0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_300);
  local_2e8._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_2e8);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}